

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  BrotliHasherParams *pBVar1;
  MemoryManager *m;
  size_t *num_commands;
  size_t *last_insert_len;
  size_t *num_literals;
  int *piVar2;
  uint8_t uVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint8_t *data;
  HasherHandle puVar10;
  size_t num_commands_00;
  undefined8 uVar11;
  int iVar12;
  BrotliEncoderState *pBVar13;
  uint8_t **ppuVar14;
  uint uVar15;
  uint32_t uVar16;
  ContextType CVar17;
  int iVar18;
  size_t sVar19;
  uint32_t *puVar20;
  uint8_t *puVar21;
  int *piVar22;
  ulong uVar23;
  Command *pCVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  uint *puVar28;
  uint *puVar29;
  byte bVar30;
  char cVar31;
  uint uVar32;
  long lVar33;
  uint16_t uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  BrotliEncoderParams *pBVar39;
  ulong uVar40;
  ushort uVar41;
  uint uVar42;
  long lVar43;
  uint8_t uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  undefined1 *static_context_map;
  ulong uVar49;
  bool bVar50;
  byte bVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  ulong local_9b8;
  size_t local_990;
  double local_980;
  size_t storage_ix_1;
  BrotliEncoderState *local_968;
  ulong local_960;
  double local_958;
  double dStack_950;
  double local_948;
  undefined8 uStack_940;
  long local_930;
  double local_928;
  undefined8 uStack_920;
  double local_918;
  undefined8 uStack_910;
  int *local_900;
  ulong local_8f8;
  int *local_8f0;
  int local_8e8;
  uint local_8e4;
  uint32_t monogram_histo [3];
  uint local_8d4;
  uint64_t local_8d0;
  uint64_t local_8c8;
  size_t *local_8c0;
  ulong local_8b8;
  uint8_t **local_8b0;
  ulong local_8a8;
  uint8_t *local_8a0;
  uint32_t combined_histo [32];
  size_t table_size;
  BlockSplit local_7e8;
  BlockSplit local_7b8;
  uint32_t *local_788;
  size_t sStack_780;
  uint32_t *local_778;
  size_t sStack_770;
  HistogramLiteral *local_768;
  size_t sStack_760;
  HistogramCommand *local_758;
  size_t sStack_750;
  HistogramDistance *local_748;
  size_t sStack_740;
  BrotliEncoderParams block_params;
  size_t storage_ix;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_698;
  
  bVar51 = 0;
  local_900 = (int *)CONCAT44(local_900._4_4_,force_flush);
  uVar8 = s->input_pos_;
  uVar9 = s->last_processed_pos_;
  local_8b0 = output;
  uVar15 = WrapPosition(uVar9);
  EnsureInitialized(s);
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  local_9b8 = uVar8 - uVar9;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  uVar6 = (s->ringbuffer_).mask_;
  uVar38 = (ulong)uVar6;
  data = (s->ringbuffer_).buffer_;
  sVar19 = InputBlockSize(s);
  if (sVar19 < local_9b8) {
    return 0;
  }
  m = &s->memory_manager_;
  uVar32 = (s->params).quality;
  uVar45 = (uint)local_9b8;
  if (uVar32 == 1) {
    if (s->command_buf_ != (uint32_t *)0x0) goto LAB_00124094;
    puVar20 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar20;
    puVar21 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar21;
    uVar32 = (s->params).quality;
  }
  if (uVar32 < 2) {
LAB_00124094:
    ppuVar14 = local_8b0;
    storage_ix = (size_t)s->last_bytes_bits_;
    if (is_last == 0 && uVar8 == uVar9) {
      sVar19 = 0;
    }
    else {
      puVar21 = GetBrotliStorage(s,(ulong)(uVar45 * 2 + 0x1f7));
      *puVar21 = (uint8_t)s->last_bytes_;
      puVar21[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      local_9b8 = local_9b8 & 0xffffffff;
      piVar22 = GetHashTable(s,(s->params).quality,local_9b8,&table_size);
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,data + (uVar6 & uVar15),local_9b8,is_last,piVar22,table_size,s->cmd_depths_,
                   s->cmd_bits_,&s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar21);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,data + (uVar6 & uVar15),local_9b8,is_last,s->command_buf_,s->literal_buf_,
                   piVar22,table_size,&storage_ix,puVar21);
      }
      sVar19 = storage_ix >> 3;
      s->last_bytes_ = (ushort)puVar21[sVar19];
      s->last_bytes_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *ppuVar14 = puVar21;
    }
    *out_size = sVar19;
    return 1;
  }
  uVar23 = s->num_commands_ + (local_9b8 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar23) {
    sVar19 = (uVar45 >> 2) + uVar23 + 0x10;
    s->cmd_alloc_size_ = sVar19;
    if (sVar19 == 0) {
      pCVar24 = (Command *)0x0;
    }
    else {
      pCVar24 = (Command *)BrotliAllocate(m,sVar19 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar24,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
    }
    s->commands_ = pCVar24;
  }
  uVar23 = local_9b8 & 0xffffffff;
  piVar22 = (int *)s->hasher_;
  local_8d0 = uVar8;
  if (piVar22 == (int *)0x0) {
    pBVar1 = &(s->params).hasher;
    uVar32 = (s->params).quality;
    if ((int)uVar32 < 10) {
      uVar42 = uVar32;
      if (uVar32 == 4) {
        if ((s->params).size_hint < 0x100000) goto LAB_001243ae;
        pBVar1->type = 0x36;
        pBVar39 = (BrotliEncoderParams *)0x400038;
      }
      else {
        if ((int)uVar32 < 5) {
LAB_001243ae:
          pBVar1->type = uVar42;
        }
        else {
          uVar42 = (s->params).lgwin;
          if ((int)uVar42 < 0x11) {
            uVar42 = 0x28;
            if (6 < uVar32) {
              uVar42 = 0x2a - (uVar32 < 9);
            }
            goto LAB_001243ae;
          }
          if ((uVar42 < 0x13) || ((s->params).size_hint < 0x100000)) {
            uVar48 = uVar32 < 7 ^ 0xf;
            uVar42 = 5;
          }
          else {
            (s->params).hasher.hash_len = 5;
            uVar48 = 0xf;
            uVar42 = 6;
          }
          iVar18 = 0x10;
          if (uVar32 < 9) {
            iVar18 = 10;
          }
          iVar35 = 4;
          if (6 < uVar32) {
            iVar35 = iVar18;
          }
          (s->params).hasher.type = uVar42;
          (s->params).hasher.block_bits = uVar32 - 1;
          (s->params).hasher.bucket_bits = uVar48;
          (s->params).hasher.num_last_distances_to_check = iVar35;
        }
        switch(uVar42) {
        case 2:
          pBVar39 = (BrotliEncoderParams *)0x4002c;
          break;
        case 3:
          pBVar39 = (BrotliEncoderParams *)0x40030;
          break;
        case 4:
switchD_001243ca_caseD_4:
          pBVar39 = (BrotliEncoderParams *)0x80038;
          break;
        case 5:
          pBVar39 = (BrotliEncoderParams *)
                    (((4L << ((byte)(s->params).hasher.block_bits & 0x3f) | 2U) <<
                     ((byte)(s->params).hasher.bucket_bits & 0x3f)) + 0x40);
          break;
        case 6:
          pBVar39 = (BrotliEncoderParams *)
                    (((4L << ((byte)(s->params).hasher.block_bits & 0x3f) | 2U) <<
                     ((byte)(s->params).hasher.bucket_bits & 0x3f)) + 0x50);
          break;
        default:
          if ((uVar42 == 0x28) || (uVar42 == 0x29)) goto switchD_001243ca_caseD_4;
          if (uVar42 == 0x2a) {
            pBVar39 = (BrotliEncoderParams *)(kStaticDictionaryHash + 0x5750);
          }
          else {
            pBVar39 = (BrotliEncoderParams *)0x28;
          }
        }
      }
    }
    else {
      (s->params).hasher.type = 10;
      uVar25 = 1L << ((byte)(s->params).lgwin & 0x3f);
      uVar37 = uVar23;
      if (uVar25 < uVar23) {
        uVar37 = uVar25;
      }
      if (uVar15 != 0 || is_last == 0) {
        uVar37 = uVar25;
      }
      pBVar39 = (BrotliEncoderParams *)(uVar37 * 8 + 0x80038);
    }
    piVar22 = (int *)BrotliAllocate(m,(size_t)pBVar39);
    s->hasher_ = (HasherHandle)piVar22;
    iVar18 = pBVar1->bucket_bits;
    iVar35 = (s->params).hasher.block_bits;
    iVar12 = (s->params).hasher.hash_len;
    piVar22[0] = pBVar1->type;
    piVar22[1] = iVar18;
    piVar22[2] = iVar35;
    piVar22[3] = iVar12;
    piVar22[4] = (s->params).hasher.num_last_distances_to_check;
    iVar18 = *piVar22;
    if (iVar18 == 0x2a) {
      iVar18 = (s->params).quality;
      *(ulong *)(s->hasher_ + 0x140428) = (ulong)((iVar18 < 7) + 7 << ((char)iVar18 - 4U & 0x1f));
    }
    else if (iVar18 == 6) {
      InitializeH6(s->hasher_,pBVar39);
    }
    else if (iVar18 == 10) {
      puVar10 = s->hasher_;
      uVar32 = -1 << ((byte)(s->params).lgwin & 0x1f);
      *(ulong *)(puVar10 + 0x28) = (ulong)~uVar32;
      *(uint *)(puVar10 + 0x80030) = uVar32 + 1;
    }
    else if ((iVar18 == 0x28) || (iVar18 == 0x29)) {
      iVar18 = (s->params).quality;
      *(ulong *)(s->hasher_ + 0x80030) = (ulong)((iVar18 < 7) + 7 << ((char)iVar18 - 4U & 0x1f));
    }
    else if (iVar18 == 5) {
      InitializeH5(s->hasher_,pBVar39);
    }
    piVar22 = (int *)s->hasher_;
    if (piVar22 == (int *)0x0) {
      piVar22 = (int *)0x0;
    }
    else {
      piVar22[5] = 0;
    }
  }
  uVar32 = (uint)(uVar15 == 0 && is_last != 0);
  uVar37 = (ulong)uVar15;
  if (piVar22[5] == 0) {
    iVar18 = *piVar22;
    switch(iVar18) {
    case 2:
      PrepareH2((HasherHandle)piVar22,uVar32,uVar23,data);
      break;
    case 3:
      PrepareH3((HasherHandle)piVar22,uVar32,uVar23,data);
      break;
    case 4:
      PrepareH4((HasherHandle)piVar22,uVar32,uVar23,data);
      break;
    case 5:
      PrepareH5((HasherHandle)piVar22,uVar32,uVar23,data);
      break;
    case 6:
      PrepareH6((HasherHandle)piVar22,uVar32,uVar23,data);
      break;
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      iVar18 = piVar22[0x2000c];
      for (lVar33 = 0; lVar33 != 0x20000; lVar33 = lVar33 + 1) {
        piVar22[lVar33 + 0xc] = iVar18;
      }
      break;
    default:
      if (iVar18 == 0x28) {
        PrepareH40((HasherHandle)piVar22,uVar32,uVar23,data);
      }
      else if (iVar18 == 0x29) {
        PrepareH41((HasherHandle)piVar22,uVar32,uVar23,data);
      }
      else if (iVar18 == 0x2a) {
        PrepareH42((HasherHandle)piVar22,uVar32,uVar23,data);
      }
      else if (iVar18 == 0x36) {
        PrepareH54((HasherHandle)piVar22,uVar32,uVar23,data);
      }
    }
    if (uVar15 == 0) {
      piVar22[6] = 0;
      piVar22[7] = 0;
      piVar22[8] = 0;
      piVar22[9] = 0;
    }
    piVar22[5] = 1;
    piVar22 = (int *)s->hasher_;
  }
  iVar18 = *piVar22;
  switch(iVar18) {
  case 2:
    if (2 < uVar15 && 6 < uVar45) {
      piVar22[((ulong)(*(long *)(data + (uVar15 - 3 & uVar6)) * -0x42e1ca5843000000) >> 0x30) + 10]
           = uVar15 - 3;
      piVar22[((ulong)(*(long *)(data + (uVar15 - 2 & uVar6)) * -0x42e1ca5843000000) >> 0x30) + 10]
           = uVar15 - 2;
      piVar22[((ulong)(*(long *)(data + (uVar15 - 1 & uVar6)) * -0x42e1ca5843000000) >> 0x30) + 10]
           = uVar15 - 1;
    }
    break;
  case 3:
    if (2 < uVar15 && 6 < uVar45) {
      uVar32 = uVar15 - 3;
      *(uint *)((long)piVar22 +
               (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar32 & uVar6)) *
                                              -0x42e1ca5843000000) >> 0x30) +
                       (uint)((uVar32 >> 3 & 1) != 0)) * 4) + 0x28) = uVar32;
      uVar32 = uVar15 - 2;
      *(uint *)((long)piVar22 +
               (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar32 & uVar6)) *
                                              -0x42e1ca5843000000) >> 0x30) +
                       (uint)((uVar32 >> 3 & 1) != 0)) * 4) + 0x28) = uVar32;
      uVar32 = uVar15 - 1;
      *(uint *)((long)piVar22 +
               (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar32 & uVar6)) *
                                              -0x42e1ca5843000000) >> 0x30) +
                       (uint)((uVar32 >> 3 & 1) != 0)) * 4) + 0x28) = uVar32;
    }
    break;
  case 4:
    if (2 < uVar15 && 6 < uVar45) {
      uVar32 = uVar15 - 3;
      piVar22[(ulong)((uint)((ulong)(*(long *)(data + (uVar32 & uVar6)) * -0x42e1ca5843000000) >>
                            0x2f) + (uVar32 >> 3 & 3)) + 10] = uVar32;
      uVar32 = uVar15 - 2;
      piVar22[(ulong)((uint)((ulong)(*(long *)(data + (uVar32 & uVar6)) * -0x42e1ca5843000000) >>
                            0x2f) + (uVar32 >> 3 & 3)) + 10] = uVar32;
      uVar32 = (uint)((ulong)(*(long *)(data + (uVar15 - 1 & uVar6)) * -0x42e1ca5843000000) >> 0x2f)
      ;
LAB_001249dc:
      piVar22[(ulong)(uVar32 + (uVar15 - 1 >> 3 & 3)) + 10] = uVar15 - 1;
    }
    break;
  case 5:
    if (2 < uVar15 && 2 < uVar45) {
      uVar32 = (uint)(*(int *)(data + (uVar15 - 3 & uVar6)) * 0x1e35a7bd) >>
               (*(byte *)(piVar22 + 0xe) & 0x1f);
      uVar5 = *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x40);
      lVar33 = *(long *)(piVar22 + 10) * 2 + 0x40;
      *(uint *)((long)piVar22 +
               (ulong)(uVar32 << (*(byte *)(piVar22 + 2) & 0x1f)) * 4 +
               (ulong)(piVar22[0xf] & (uint)uVar5) * 4 + lVar33) = uVar15 - 3;
      *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x40) = uVar5 + 1;
      uVar32 = (uint)(*(int *)(data + (uVar15 - 2 & uVar6)) * 0x1e35a7bd) >>
               (*(byte *)(piVar22 + 0xe) & 0x1f);
      uVar5 = *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x40);
      *(uint *)((long)piVar22 +
               (ulong)(uVar32 << (*(byte *)(piVar22 + 2) & 0x1f)) * 4 +
               (ulong)(piVar22[0xf] & (uint)uVar5) * 4 + lVar33) = uVar15 - 2;
      *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x40) = uVar5 + 1;
      uVar32 = (uint)(*(int *)(data + (uVar15 - 1 & uVar6)) * 0x1e35a7bd) >>
               (*(byte *)(piVar22 + 0xe) & 0x1f);
      uVar5 = *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x40);
      *(uint *)((long)piVar22 +
               (ulong)(uVar32 << (*(byte *)(piVar22 + 2) & 0x1f)) * 4 +
               (ulong)(piVar22[0xf] & (uint)uVar5) * 4 + lVar33) = uVar15 - 1;
      *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x40) = uVar5 + 1;
    }
    break;
  case 6:
    if (2 < uVar15 && 6 < uVar45) {
      uVar23 = *(ulong *)(piVar22 + 0x10);
      uVar37 = (*(ulong *)(data + (uVar15 - 3 & uVar6)) & uVar23) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)(piVar22 + 0xe) & 0x3f);
      uVar25 = uVar37 & 0xffffffff;
      uVar5 = *(ushort *)((long)piVar22 + uVar25 * 2 + 0x50);
      lVar33 = *(long *)(piVar22 + 10) * 2 + 0x50;
      *(uint *)((long)piVar22 +
               (ulong)(uint)((int)uVar37 << (*(byte *)(piVar22 + 2) & 0x1f)) * 4 +
               (ulong)(piVar22[0x12] & (uint)uVar5) * 4 + lVar33) = uVar15 - 3;
      *(ushort *)((long)piVar22 + uVar25 * 2 + 0x50) = uVar5 + 1;
      uVar37 = (*(ulong *)(data + (uVar15 - 2 & uVar6)) & uVar23) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)(piVar22 + 0xe) & 0x3f);
      uVar25 = uVar37 & 0xffffffff;
      uVar5 = *(ushort *)((long)piVar22 + uVar25 * 2 + 0x50);
      *(uint *)((long)piVar22 +
               (ulong)(uint)((int)uVar37 << (*(byte *)(piVar22 + 2) & 0x1f)) * 4 +
               (ulong)(piVar22[0x12] & (uint)uVar5) * 4 + lVar33) = uVar15 - 2;
      *(ushort *)((long)piVar22 + uVar25 * 2 + 0x50) = uVar5 + 1;
      uVar23 = (uVar23 & *(ulong *)(data + (uVar15 - 1 & uVar6))) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)(piVar22 + 0xe) & 0x3f);
      uVar37 = uVar23 & 0xffffffff;
      uVar5 = *(ushort *)((long)piVar22 + uVar37 * 2 + 0x50);
      *(uint *)((long)piVar22 +
               (ulong)(uint)((int)uVar23 << (*(byte *)(piVar22 + 2) & 0x1f)) * 4 +
               (ulong)(piVar22[0x12] & (uint)uVar5) * 4 + lVar33) = uVar15 - 1;
      *(ushort *)((long)piVar22 + uVar37 * 2 + 0x50) = uVar5 + 1;
    }
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    if (0x7f < uVar15 && 2 < uVar45) {
      uVar25 = uVar37 - 0x7f;
      uVar23 = (uVar37 + uVar23) - 0x7f;
      if (uVar37 < uVar23) {
        uVar23 = uVar37;
      }
      for (; local_8c0 = (size_t *)piVar22, uVar25 < uVar23; uVar25 = uVar25 + 1) {
        local_960 = *(ulong *)(piVar22 + 10);
        uVar49 = uVar37 - uVar25;
        if (uVar37 - uVar25 < 0x10) {
          uVar49 = 0xf;
        }
        local_8f0 = (int *)(local_960 - uVar49);
        uVar26 = (ulong)((uint)uVar25 & uVar6);
        uVar49 = (ulong)((uint)(*(int *)(data + uVar26) * 0x1e35a7bd) >> 0xf);
        uVar32 = piVar22[uVar49 + 0xc];
        local_948 = (double)((local_960 & uVar25) * 2 + 1);
        local_928 = (double)((local_960 & uVar25) * 2);
        piVar22[uVar49 + 0xc] = (uint)uVar25;
        uVar49 = 0;
        local_958 = 0.0;
        lVar33 = 0x40;
        while (uVar25 != uVar32) {
          bVar50 = lVar33 == 0;
          lVar33 = lVar33 + -1;
          if ((local_8f0 < uVar25 - uVar32) || (bVar50)) break;
          dVar60 = local_958;
          if (uVar49 < (ulong)local_958) {
            dVar60 = (double)uVar49;
          }
          lVar27 = (long)dVar60 + (ulong)(uVar32 & uVar6);
          uVar36 = 0x80 - (long)dVar60;
          uVar40 = uVar36 & 0xfffffffffffffff8;
          uVar46 = 0;
          lVar43 = 0;
LAB_00124cc6:
          if (uVar36 >> 3 == uVar46) {
            uVar47 = (ulong)((uint)uVar36 & 7);
            puVar21 = data + (lVar27 - lVar43);
            for (; (bVar50 = uVar47 != 0, uVar47 = uVar47 - 1, uVar46 = uVar36, bVar50 &&
                   (uVar46 = uVar40, data[uVar40 + (long)dVar60 + uVar26] == *puVar21));
                uVar40 = uVar40 + 1) {
              puVar21 = puVar21 + 1;
            }
          }
          else {
            if (*(ulong *)(data + uVar46 * 8 + lVar27) ==
                *(ulong *)(data + uVar46 * 8 + (long)dVar60 + uVar26)) goto code_r0x00124cdc;
            uVar40 = *(ulong *)(data + uVar46 * 8 + (long)dVar60 + uVar26) ^
                     *(ulong *)(data + uVar46 * 8 + lVar27);
            uVar36 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar46 = (uVar36 >> 3 & 0x1fffffff) - lVar43;
          }
          uVar46 = uVar46 + (long)dVar60;
          if (0x7f < uVar46) {
            piVar22[(long)local_928 + 0x2000e] =
                 piVar22[(ulong)((uint)local_960 & uVar32) * 2 + 0x2000e];
            iVar18 = piVar22[(ulong)((uint)local_960 & uVar32) * 2 + 0x2000f];
            goto LAB_00124df4;
          }
          dVar60 = (double)((ulong)(uVar32 & (uint)local_960) * 2);
          if (data[uVar46 + (uVar32 & uVar6)] < data[uVar46 + uVar26]) {
            piVar22[(long)local_928 + 0x2000e] = uVar32;
            dVar60 = (double)((ulong)dVar60 | 1);
            uVar49 = uVar46;
            local_928 = dVar60;
          }
          else {
            piVar22[(long)local_948 + 0x2000e] = uVar32;
            local_958 = (double)uVar46;
            local_948 = dVar60;
          }
          uVar32 = piVar22[(long)dVar60 + 0x2000e];
        }
        iVar18 = piVar22[0x2000c];
        piVar22[(long)local_928 + 0x2000e] = iVar18;
LAB_00124df4:
        piVar22[(long)local_948 + 0x2000e] = iVar18;
      }
    }
    break;
  default:
    if ((iVar18 == 0x28) || (iVar18 == 0x29)) {
      if (2 < uVar15 && 2 < uVar45) {
        uVar23 = uVar37 - 3;
        uVar32 = (uint)(*(int *)(data + ((uint)uVar23 & uVar6)) * 0x1e35a7bd) >> 0x11;
        uVar25 = (ulong)uVar32;
        uVar5 = *(ushort *)(piVar22 + 0x2000a);
        uVar49 = uVar23 - (uint)piVar22[uVar25 + 10];
        *(char *)((long)piVar22 + (uVar23 & 0xffff) + 0x30028) = (char)uVar32;
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(short *)(piVar22 + (ulong)uVar5 + 0x1000a) = (short)uVar49;
        *(undefined2 *)((long)piVar22 + (ulong)uVar5 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar22 + uVar25 * 2 + 0x20028);
        piVar22[uVar25 + 10] = (uint)uVar23;
        *(ushort *)((long)piVar22 + uVar25 * 2 + 0x20028) = uVar5;
        uVar23 = uVar37 - 2;
        uVar41 = uVar5 + 1;
        uVar32 = (uint)(*(int *)(data + ((uint)uVar23 & uVar6)) * 0x1e35a7bd) >> 0x11;
        uVar25 = (ulong)uVar32;
        uVar49 = uVar23 - (uint)piVar22[uVar25 + 10];
        *(char *)((long)piVar22 + (uVar23 & 0xffff) + 0x30028) = (char)uVar32;
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(short *)(piVar22 + (ulong)uVar41 + 0x1000a) = (short)uVar49;
        *(undefined2 *)((long)piVar22 + (ulong)uVar41 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar22 + uVar25 * 2 + 0x20028);
        piVar22[uVar25 + 10] = (uint)uVar23;
        *(ushort *)((long)piVar22 + uVar25 * 2 + 0x20028) = uVar41;
        uVar37 = uVar37 - 1;
        uVar41 = uVar5 + 2;
        uVar32 = (uint)(*(int *)(data + ((uint)uVar37 & uVar6)) * 0x1e35a7bd) >> 0x11;
        uVar23 = (ulong)uVar32;
        *(ushort *)(piVar22 + 0x2000a) = uVar5 + 3;
        uVar25 = uVar37 - (uint)piVar22[uVar23 + 10];
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(char *)((long)piVar22 + (uVar37 & 0xffff) + 0x30028) = (char)uVar32;
        *(short *)(piVar22 + (ulong)uVar41 + 0x1000a) = (short)uVar25;
        *(undefined2 *)((long)piVar22 + (ulong)uVar41 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar22 + uVar23 * 2 + 0x20028);
        piVar22[uVar23 + 10] = (uint)uVar37;
        *(ushort *)((long)piVar22 + uVar23 * 2 + 0x20028) = uVar41;
      }
    }
    else if (iVar18 == 0x2a) {
      if (2 < uVar15 && 2 < uVar45) {
        uVar23 = uVar37 - 3;
        uVar32 = (uint)(*(int *)(data + ((uint)uVar23 & uVar6)) * 0x1e35a7bd) >> 0x11;
        uVar25 = (ulong)uVar32;
        uVar48 = uVar32 & 0x1ff;
        uVar5 = *(ushort *)((long)piVar22 + (ulong)uVar48 * 2 + 0x140028);
        *(ushort *)((long)piVar22 + (ulong)uVar48 * 2 + 0x140028) = uVar5 + 1;
        uVar42 = uVar5 & 0x1ff;
        uVar49 = uVar23 - (uint)piVar22[uVar25 + 10];
        *(char *)((long)piVar22 + (uVar23 & 0xffff) + 0x30028) = (char)uVar32;
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(short *)((long)piVar22 + (ulong)uVar42 * 4 + (ulong)(uVar48 << 0xb) + 0x40028) =
             (short)uVar49;
        *(undefined2 *)((long)piVar22 + (ulong)uVar42 * 4 + (ulong)(uVar48 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar22 + uVar25 * 2 + 0x20028);
        piVar22[uVar25 + 10] = (uint)uVar23;
        *(short *)((long)piVar22 + uVar25 * 2 + 0x20028) = (short)uVar42;
        uVar23 = uVar37 - 2;
        uVar32 = (uint)(*(int *)(data + ((uint)uVar23 & uVar6)) * 0x1e35a7bd) >> 0x11;
        uVar25 = (ulong)uVar32;
        uVar48 = uVar32 & 0x1ff;
        uVar5 = *(ushort *)((long)piVar22 + (ulong)uVar48 * 2 + 0x140028);
        *(ushort *)((long)piVar22 + (ulong)uVar48 * 2 + 0x140028) = uVar5 + 1;
        uVar42 = uVar5 & 0x1ff;
        uVar49 = uVar23 - (uint)piVar22[uVar25 + 10];
        *(char *)((long)piVar22 + (uVar23 & 0xffff) + 0x30028) = (char)uVar32;
        if (0xfffe < uVar49) {
          uVar49 = 0xffff;
        }
        *(short *)((long)piVar22 + (ulong)uVar42 * 4 + (ulong)(uVar48 << 0xb) + 0x40028) =
             (short)uVar49;
        *(undefined2 *)((long)piVar22 + (ulong)uVar42 * 4 + (ulong)(uVar48 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar22 + uVar25 * 2 + 0x20028);
        piVar22[uVar25 + 10] = (uint)uVar23;
        *(short *)((long)piVar22 + uVar25 * 2 + 0x20028) = (short)uVar42;
        uVar37 = uVar37 - 1;
        uVar42 = (uint)(*(int *)(data + ((uint)uVar37 & uVar6)) * 0x1e35a7bd) >> 0x11;
        uVar23 = (ulong)uVar42;
        uVar32 = uVar42 & 0x1ff;
        uVar5 = *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x140028);
        *(ushort *)((long)piVar22 + (ulong)uVar32 * 2 + 0x140028) = uVar5 + 1;
        uVar48 = uVar5 & 0x1ff;
        uVar25 = uVar37 - (uint)piVar22[uVar23 + 10];
        *(char *)((long)piVar22 + (uVar37 & 0xffff) + 0x30028) = (char)uVar42;
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(short *)((long)piVar22 + (ulong)uVar48 * 4 + (ulong)(uVar32 << 0xb) + 0x40028) =
             (short)uVar25;
        *(undefined2 *)((long)piVar22 + (ulong)uVar48 * 4 + (ulong)(uVar32 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar22 + uVar23 * 2 + 0x20028);
        piVar22[uVar23 + 10] = (uint)uVar37;
        *(short *)((long)piVar22 + uVar23 * 2 + 0x20028) = (short)uVar48;
      }
    }
    else if ((iVar18 == 0x36) && (2 < uVar15 && 6 < uVar45)) {
      uVar32 = uVar15 - 3;
      piVar22[(ulong)((uint)((ulong)(*(long *)(data + (uVar32 & uVar6)) * 0x35a7bd1e35a7bd00) >>
                            0x2c) + (uVar32 >> 3 & 3)) + 10] = uVar32;
      uVar32 = uVar15 - 2;
      piVar22[(ulong)((uint)((ulong)(*(long *)(data + (uVar32 & uVar6)) * 0x35a7bd1e35a7bd00) >>
                            0x2c) + (uVar32 >> 3 & 3)) + 10] = uVar32;
      uVar32 = (uint)((ulong)(*(long *)(data + (uVar15 - 1 & uVar6)) * 0x35a7bd1e35a7bd00) >> 0x2c);
      goto LAB_001249dc;
    }
  }
  local_990 = 1;
  uVar8 = s->last_flush_pos_;
  local_968 = s;
  local_8c8 = uVar9;
  uVar16 = WrapPosition(uVar8);
  CVar17 = ChooseContextMode(&s->params,data,(ulong)uVar16,uVar38,s->input_pos_ - uVar8);
  uVar23 = (ulong)CVar17;
  sVar19 = s->num_commands_;
  if (sVar19 == 0) {
LAB_0012532a:
    uVar45 = (uint)local_9b8;
  }
  else if (s->last_insert_len_ == 0) {
    pCVar24 = s->commands_;
    uVar25 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar32 = pCVar24[sVar19 - 1].copy_len_;
    uVar45 = uVar32 & 0x1ffffff;
    uVar37 = s->last_processed_pos_ - (ulong)uVar45;
    if (uVar25 <= uVar37) {
      uVar37 = uVar25;
    }
    iVar18 = s->dist_cache_[0];
    uVar5 = pCVar24[sVar19 - 1].dist_prefix_;
    uVar48 = uVar5 & 0x3ff;
    uVar16 = (s->params).dist.num_direct_distance_codes;
    uVar42 = uVar16 + 0x10;
    if (uVar42 <= uVar48) {
      uVar7 = (s->params).dist.distance_postfix_bits;
      bVar30 = (byte)uVar7;
      uVar48 = (uVar48 - uVar16) - 0x10;
      uVar48 = (~(-1 << (bVar30 & 0x1f)) & uVar48) + uVar42 +
               (pCVar24[sVar19 - 1].dist_extra_ +
                (((uVar48 >> (uVar7 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar5 >> 10) & 0x1f)) + -4 <<
               (bVar30 & 0x1f));
    }
    s = local_968;
    local_960 = uVar23;
    if ((ulong)(uVar48 - 0xf) == (long)iVar18 || uVar48 < 0x10) {
      if ((ulong)(long)iVar18 <= uVar37) {
        uVar45 = (local_968->ringbuffer_).mask_;
        puVar21 = (local_968->ringbuffer_).buffer_;
        iVar35 = uVar15 + (int)local_8d0;
        uVar16 = uVar15;
        while ((uVar15 = iVar35 - (int)local_8c8, (int)local_9b8 != 0 &&
               (uVar15 = uVar16, puVar21[uVar16 & uVar45] == puVar21[uVar16 - iVar18 & uVar45]))) {
          uVar32 = uVar32 + 1;
          pCVar24[sVar19 - 1].copy_len_ = uVar32;
          uVar16 = uVar16 + 1;
          local_9b8 = (ulong)((int)local_9b8 - 1);
        }
        uVar45 = uVar32 & 0x1ffffff;
      }
      uVar42 = pCVar24[sVar19 - 1].insert_len_;
      uVar45 = (uVar32 >> 0x19) + uVar45;
      uVar32 = uVar42;
      if (5 < (ulong)uVar42) {
        if (uVar42 < 0x82) {
          uVar37 = (ulong)uVar42 - 2;
          uVar32 = 0x1f;
          uVar42 = (uint)uVar37;
          if (uVar42 != 0) {
            for (; uVar42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (int)(uVar37 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar32 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar42 < 0x842) {
          uVar32 = 0x1f;
          if (uVar42 - 0x42 != 0) {
            for (; uVar42 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (uVar32 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar32 = 0x15;
          if (0x1841 < uVar42) {
            uVar32 = (uint)(ushort)(0x17 - (uVar42 < 0x5842));
          }
        }
      }
      if (uVar45 < 10) {
        uVar42 = uVar45 - 2;
      }
      else if (uVar45 < 0x86) {
        uVar42 = 0x1f;
        uVar48 = (uint)((ulong)uVar45 - 6);
        if (uVar48 != 0) {
          for (; uVar48 >> uVar42 == 0; uVar42 = uVar42 - 1) {
          }
        }
        uVar42 = (int)((ulong)uVar45 - 6 >> ((char)(uVar42 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar42 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar42 = 0x17;
        if (uVar45 < 0x846) {
          uVar42 = 0x1f;
          if (uVar45 - 0x46 != 0) {
            for (; uVar45 - 0x46 >> uVar42 == 0; uVar42 = uVar42 - 1) {
            }
          }
          uVar42 = (uVar42 ^ 0xffe0) + 0x2c;
        }
      }
      uVar41 = (ushort)uVar42;
      uVar34 = (uVar41 & 7) + ((ushort)uVar32 & 7) * 8;
      if ((((uVar5 & 0x3ff) == 0) && ((ushort)uVar32 < 8)) && (uVar41 < 0x10)) {
        if (7 < uVar41) {
          uVar34 = uVar34 + 0x40;
        }
      }
      else {
        iVar18 = ((uVar32 & 0xffff) >> 3) * 3 + ((uVar42 & 0xffff) >> 3);
        uVar34 = uVar34 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar18 * 0x40 + 0x40;
      }
      pCVar24[sVar19 - 1].cmd_prefix_ = uVar34;
    }
    goto LAB_0012532a;
  }
  num_commands = &s->num_commands_;
  iVar18 = (s->params).quality;
  uVar25 = (ulong)uVar45;
  uVar37 = (ulong)uVar15;
  puVar10 = s->hasher_;
  local_8f0 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar24 = s->commands_ + sVar19;
  num_literals = &s->num_literals_;
  if (iVar18 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,uVar25,uVar37,data,uVar38,&s->params,puVar10,local_8f0,last_insert_len,pCVar24,
               num_commands,num_literals);
  }
  else if (iVar18 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,uVar25,uVar37,data,uVar38,&s->params,puVar10,local_8f0,last_insert_len,pCVar24,
               num_commands,num_literals);
  }
  else {
    BrotliCreateBackwardReferences
              (uVar25,uVar37,data,uVar38,&s->params,puVar10,local_8f0,last_insert_len,pCVar24,
               num_commands,num_literals);
  }
  iVar18 = (s->params).lgwin;
  iVar35 = (s->params).lgblock;
  if (iVar35 < iVar18) {
    iVar35 = iVar18;
  }
  cVar31 = '\x17';
  if (iVar35 < 0x17) {
    cVar31 = (char)iVar35;
  }
  uVar37 = 1L << (cVar31 + 1U & 0x3f);
  uVar8 = s->input_pos_;
  uVar9 = s->last_flush_pos_;
  sVar19 = InputBlockSize(s);
  if ((s->params).quality < 4) {
    bVar50 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar50 = false;
  }
  if ((((int)local_900 == 0 && is_last == 0) && (!bVar50)) &&
     (((uVar8 - uVar9) + sVar19 <= uVar37 &&
      ((uVar37 = uVar37 >> 3, s->num_literals_ < uVar37 && (*num_commands < uVar37)))))) {
    iVar18 = UpdateLastProcessedPos(s);
    if ((iVar18 != 0) && (puVar10 = s->hasher_, puVar10 != (HasherHandle)0x0)) {
      puVar10[0x14] = '\0';
      puVar10[0x15] = '\0';
      puVar10[0x16] = '\0';
      puVar10[0x17] = '\0';
    }
LAB_0012570d:
    *out_size = 0;
    return 1;
  }
  uVar37 = s->last_insert_len_;
  if (uVar37 != 0) {
    pCVar24 = s->commands_;
    sVar19 = s->num_commands_;
    s->num_commands_ = sVar19 + 1;
    pCVar24[sVar19].insert_len_ = (uint32_t)uVar37;
    pCVar24[sVar19].copy_len_ = 0x8000000;
    pCVar24[sVar19].dist_extra_ = 0;
    pCVar24[sVar19].dist_prefix_ = 0x10;
    if (uVar37 < 6) {
      uVar25 = uVar37 & 0xffffffff;
    }
    else if (uVar37 < 0x82) {
      uVar15 = 0x1f;
      uVar32 = (uint)(uVar37 - 2);
      if (uVar32 != 0) {
        for (; uVar32 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar25 = (ulong)((int)(uVar37 - 2 >> ((char)(uVar15 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar15 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar37 < 0x842) {
      uVar32 = (uint32_t)uVar37 - 0x42;
      uVar15 = 0x1f;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar25 = (ulong)((uVar15 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar25 = 0x15;
      if (0x1841 < uVar37) {
        uVar25 = (ulong)(ushort)(0x17 - (uVar37 < 0x5842));
      }
    }
    iVar18 = (int)((uVar25 & 0xffff) >> 3) * 3;
    pCVar24[sVar19].cmd_prefix_ =
         ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar18 * 0x40 +
         ((ushort)uVar25 & 7) * 8 + 0x42;
    s->num_literals_ = s->num_literals_ + uVar37;
    s->last_insert_len_ = 0;
  }
  uVar37 = s->input_pos_ - s->last_flush_pos_;
  if (uVar37 == 0 && is_last == 0) goto LAB_0012570d;
  local_960 = uVar23;
  local_8c0 = num_commands;
  puVar21 = GetBrotliStorage(s,(ulong)((uint)uVar37 * 2 + 0x1f7));
  storage_ix_1 = (size_t)s->last_bytes_bits_;
  *puVar21 = (uint8_t)s->last_bytes_;
  puVar21[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  uVar8 = s->last_flush_pos_;
  local_958 = (double)CONCAT71(local_958._1_7_,s->prev_byte_);
  local_948 = (double)CONCAT71(local_948._1_7_,s->prev_byte2_);
  sVar19 = s->num_literals_;
  pCVar24 = s->commands_;
  num_commands_00 = s->num_commands_;
  local_900 = s->saved_dist_cache_;
  uVar16 = WrapPosition(uVar8);
  pBVar39 = &block_params;
  for (lVar33 = 0x10; lVar33 != 0; lVar33 = lVar33 + -1) {
    iVar18 = (s->params).quality;
    pBVar39->mode = (s->params).mode;
    pBVar39->quality = iVar18;
    s = (BrotliEncoderState *)((long)s + (ulong)bVar51 * -0x10 + 8);
    pBVar39 = (BrotliEncoderParams *)((long)pBVar39 + (ulong)bVar51 * -0x10 + 8);
  }
  uVar23 = uVar37 & 0xffffffff;
  if (uVar23 == 0) {
    *(ulong *)(puVar21 + (storage_ix_1 >> 3)) =
         3L << ((byte)storage_ix_1 & 7) | (ulong)puVar21[storage_ix_1 >> 3];
    storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
    piVar22 = local_900;
    goto LAB_0012670c;
  }
  iVar18 = ShouldCompress(data,uVar38,uVar8,uVar23,sVar19,num_commands_00);
  piVar22 = local_900;
  uVar25 = (ulong)uVar16;
  if (iVar18 == 0) {
    uVar11 = *(undefined8 *)(local_900 + 2);
    *(undefined8 *)local_8f0 = *(undefined8 *)local_900;
    *(undefined8 *)(local_8f0 + 2) = uVar11;
    BrotliStoreUncompressedMetaBlock(is_last,data,uVar25,uVar38,uVar23,&storage_ix_1,puVar21);
    goto LAB_0012670c;
  }
  uVar3 = *puVar21;
  local_8d0 = CONCAT71(local_8d0._1_7_,puVar21[1]);
  local_8c8 = storage_ix_1 & 0xff;
  iVar18 = (local_968->params).quality;
  if (iVar18 < 3) {
    BrotliStoreMetaBlockFast
              (m,data,uVar25,uVar23,uVar38,is_last,&local_968->params,pCVar24,num_commands_00,
               &storage_ix_1,puVar21);
  }
  else if (iVar18 == 3) {
    BrotliStoreMetaBlockTrivial
              (m,data,uVar25,uVar23,uVar38,is_last,&local_968->params,pCVar24,num_commands_00,
               &storage_ix_1,puVar21);
  }
  else {
    BrotliInitBlockSplit((BlockSplit *)&table_size);
    BrotliInitBlockSplit(&local_7e8);
    BrotliInitBlockSplit(&local_7b8);
    local_748 = (HistogramDistance *)0x0;
    sStack_740 = 0;
    local_758 = (HistogramCommand *)0x0;
    sStack_750 = 0;
    local_768 = (HistogramLiteral *)0x0;
    sStack_760 = 0;
    local_778 = (uint32_t *)0x0;
    sStack_770 = 0;
    local_788 = (uint32_t *)0x0;
    sStack_780 = 0;
    local_8e8 = (local_968->params).quality;
    local_8f8 = (ulong)local_948 & 0xff;
    local_8b8 = uVar23;
    local_8e4 = (uint)local_958._0_1_;
    if (local_8e8 < 10) {
      local_8a0 = "" + ((ContextType)local_960 << 9);
      uVar44 = local_948._0_1_;
      if ((local_968->params).disable_literal_context_modeling == 0) {
        if ((uint)uVar37 < 0x40 || local_8e8 < 5) {
          static_context_map = (undefined1 *)0x0;
        }
        else {
          uVar23 = uVar23 + uVar25;
          if (0xfffff < (local_968->params).size_hint) {
            combined_histo[0x1c] = 0;
            combined_histo[0x1d] = 0;
            combined_histo[0x1e] = 0;
            combined_histo[0x1f] = 0;
            combined_histo[0x18] = 0;
            combined_histo[0x19] = 0;
            combined_histo[0x1a] = 0;
            combined_histo[0x1b] = 0;
            combined_histo[0x14] = 0;
            combined_histo[0x15] = 0;
            combined_histo[0x16] = 0;
            combined_histo[0x17] = 0;
            combined_histo[0x10] = 0;
            combined_histo[0x11] = 0;
            combined_histo[0x12] = 0;
            combined_histo[0x13] = 0;
            combined_histo[0xc] = 0;
            combined_histo[0xd] = 0;
            combined_histo[0xe] = 0;
            combined_histo[0xf] = 0;
            combined_histo[8] = 0;
            combined_histo[9] = 0;
            combined_histo[10] = 0;
            combined_histo[0xb] = 0;
            combined_histo[4] = 0;
            combined_histo[5] = 0;
            combined_histo[6] = 0;
            combined_histo[7] = 0;
            combined_histo[0] = 0;
            combined_histo[1] = 0;
            combined_histo[2] = 0;
            combined_histo[3] = 0;
            memset(&storage_ix,0,0x680);
            local_980 = 0.0;
            static_context_map = ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8;
            for (uVar37 = uVar25; uVar37 + 0x40 <= uVar23; uVar37 = uVar37 + 0x1000) {
              uVar15 = (uint)uVar37;
              bVar51 = data[uVar15 + 1 & uVar6];
              uVar49 = (ulong)data[uVar15 & uVar6];
              for (lVar33 = 2; uVar26 = (ulong)bVar51, lVar33 != 0x40; lVar33 = lVar33 + 1) {
                bVar30 = ""[uVar49 + 0x500];
                bVar4 = ""[uVar26 + 0x400];
                bVar51 = data[uVar15 + (int)lVar33 & uVar6];
                combined_histo[bVar51 >> 3] = combined_histo[bVar51 >> 3] + 1;
                piVar22 = (int *)((long)&storage_ix +
                                 (ulong)(bVar51 >> 3) * 4 +
                                 (ulong)(byte)ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8
                                              [(ulong)(bVar30 | bVar4) * 4] * 0x80);
                *piVar22 = *piVar22 + 1;
                uVar49 = uVar26;
              }
              local_980 = local_980 + 62.0;
            }
            local_918 = 0.0;
            uStack_910 = 0;
            uVar37 = 0;
            local_8a8 = uVar23;
            for (uVar23 = 0; uVar23 < 0x80; uVar23 = uVar23 + 8) {
              uVar49 = (ulong)*(uint *)((long)combined_histo + uVar23);
              if (uVar49 < 0x100) {
                dVar60 = (double)kLog2Table[uVar49];
              }
              else {
                dVar60 = log2((double)uVar49);
              }
              uVar26 = (ulong)*(uint *)((long)combined_histo + uVar23 + 4);
              if (uVar26 < 0x100) {
                dVar52 = (double)kLog2Table[uVar26];
              }
              else {
                local_958 = dVar60;
                dVar52 = log2((double)uVar26);
                dVar60 = local_958;
              }
              uVar37 = uVar37 + uVar49 + uVar26;
              local_918 = (local_918 - (double)uVar49 * dVar60) - (double)uVar26 * dVar52;
            }
            if (uVar37 != 0) {
              auVar54._8_4_ = (int)(uVar37 >> 0x20);
              auVar54._0_8_ = uVar37;
              auVar54._12_4_ = 0x45300000;
              dVar60 = (auVar54._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar37) - 4503599627370496.0);
              if (uVar37 < 0x100) {
                dVar52 = (double)kLog2Table[uVar37];
              }
              else {
                dVar52 = log2(dVar60);
              }
              local_918 = local_918 + dVar60 * dVar52;
            }
            dVar60 = 0.0;
            lVar33 = (long)&storage_ix + 4;
            lVar27 = 0;
            while (lVar27 != 0xd) {
              dVar52 = 0.0;
              uVar37 = 0;
              local_930 = lVar27;
              for (uVar23 = 0; uVar23 < 0x80; uVar23 = uVar23 + 8) {
                uVar49 = (ulong)*(uint *)(lVar33 + -4 + uVar23);
                local_958 = (double)uVar49;
                if (uVar49 < 0x100) {
                  dVar61 = (double)kLog2Table[uVar49];
                }
                else {
                  dVar61 = log2(local_958);
                }
                uVar26 = (ulong)*(uint *)(lVar33 + uVar23);
                dVar62 = (double)uVar26;
                if (uVar26 < 0x100) {
                  dVar53 = (double)kLog2Table[uVar26];
                }
                else {
                  local_948 = dVar61;
                  local_928 = dVar62;
                  dVar53 = log2(dVar62);
                  dVar61 = local_948;
                  dVar62 = local_928;
                }
                uVar37 = uVar37 + uVar49 + uVar26;
                dVar52 = (dVar52 - local_958 * dVar61) - dVar62 * dVar53;
              }
              if (uVar37 != 0) {
                auVar55._8_4_ = (int)(uVar37 >> 0x20);
                auVar55._0_8_ = uVar37;
                auVar55._12_4_ = 0x45300000;
                dVar62 = auVar55._8_8_ - 1.9342813113834067e+25;
                dVar61 = dVar62 + ((double)CONCAT44(0x43300000,(int)uVar37) - 4503599627370496.0);
                if (uVar37 < 0x100) {
                  dVar62 = (double)kLog2Table[uVar37];
                }
                else {
                  local_958 = dVar61;
                  dStack_950 = dVar62;
                  dVar62 = log2(dVar61);
                  dVar61 = local_958;
                }
                dVar52 = dVar52 + dVar61 * dVar62;
              }
              dVar60 = dVar60 + dVar52;
              lVar33 = lVar33 + 0x80;
              lVar27 = local_930 + 1;
            }
            dVar60 = dVar60 * (1.0 / local_980);
            uVar23 = local_8a8;
            if ((dVar60 <= 3.0) && (0.2 <= (1.0 / local_980) * local_918 - dVar60)) {
              local_990 = 0xd;
              uVar44 = (uint8_t)local_8f8;
              goto LAB_00126531;
            }
          }
          local_990 = 3;
          puVar29 = monogram_histo + 1;
          local_6a8 = 0;
          uStack_6a0 = 0;
          local_698 = 0;
          storage_ix = 0;
          uStack_6b0 = 0;
          for (uVar37 = uVar25; uVar37 + 0x40 <= uVar23; uVar37 = uVar37 + 0x1000) {
            piVar22 = (int *)(DecideOverLiteralContextModeling_lut +
                             (ulong)(data[(uint)uVar37 & uVar6] >> 6) * 4);
            for (lVar33 = 1; lVar33 != 0x40; lVar33 = lVar33 + 1) {
              iVar18 = *piVar22;
              piVar22 = (int *)(DecideOverLiteralContextModeling_lut +
                               (ulong)(data[uVar6 & (uint)uVar37 + (int)lVar33] >> 6) * 4);
              piVar2 = (int *)((long)&storage_ix + ((long)*piVar22 + (long)iVar18 * 3) * 4);
              *piVar2 = *piVar2 + 1;
            }
          }
          puVar20 = monogram_histo;
          monogram_histo[2] = 0;
          monogram_histo[0] = 0;
          monogram_histo[1] = 0;
          combined_histo[0] = 0;
          combined_histo[1] = 0;
          combined_histo[2] = 0;
          combined_histo[3] = 0;
          combined_histo[4] = 0;
          combined_histo[5] = 0;
          for (uVar23 = 0; uVar23 != 9; uVar23 = uVar23 + 1) {
            iVar18 = *(int *)((long)&storage_ix + uVar23 * 4);
            puVar20[(uVar23 / 3) * -3] = puVar20[(uVar23 / 3) * -3] + iVar18;
            uVar37 = uVar23;
            if (5 < uVar23) {
              uVar37 = uVar23 - 6;
            }
            combined_histo[uVar37] = combined_histo[uVar37] + iVar18;
            puVar20 = puVar20 + 1;
          }
          bVar50 = true;
          local_918 = 0.0;
          uStack_910 = 0;
          lVar33 = 0;
          puVar28 = monogram_histo;
          while( true ) {
            uVar23 = (ulong)*puVar28;
            if (uVar23 < 0x100) {
              dVar60 = (double)kLog2Table[uVar23];
            }
            else {
              dVar60 = log2((double)uVar23);
            }
            uVar37 = lVar33 + uVar23;
            local_918 = local_918 - (double)uVar23 * dVar60;
            if (!bVar50) break;
            uVar23 = (ulong)*puVar29;
            if (uVar23 < 0x100) {
              dVar60 = (double)kLog2Table[uVar23];
            }
            else {
              dVar60 = log2((double)uVar23);
            }
            lVar33 = uVar37 + uVar23;
            local_918 = local_918 - (double)uVar23 * dVar60;
            bVar50 = false;
            puVar29 = &local_8d4;
            puVar28 = monogram_histo + 2;
          }
          if (uVar37 != 0) {
            auVar56._8_4_ = (int)(uVar37 >> 0x20);
            auVar56._0_8_ = uVar37;
            auVar56._12_4_ = 0x45300000;
            dVar60 = (auVar56._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar37) - 4503599627370496.0);
            if (uVar37 < 0x100) {
              dVar52 = (double)kLog2Table[uVar37];
            }
            else {
              dVar52 = log2(dVar60);
            }
            local_918 = local_918 + dVar60 * dVar52;
          }
          bVar50 = true;
          local_948 = 0.0;
          uStack_940 = 0;
          lVar33 = 0;
          puVar29 = combined_histo;
          puVar28 = combined_histo + 1;
          while( true ) {
            uVar23 = (ulong)*puVar29;
            if (uVar23 < 0x100) {
              dVar60 = (double)kLog2Table[uVar23];
            }
            else {
              dVar60 = log2((double)uVar23);
            }
            uVar37 = lVar33 + uVar23;
            local_948 = local_948 - (double)uVar23 * dVar60;
            if (!bVar50) break;
            uVar23 = (ulong)*puVar28;
            if (uVar23 < 0x100) {
              dVar60 = (double)kLog2Table[uVar23];
            }
            else {
              dVar60 = log2((double)uVar23);
            }
            lVar33 = uVar37 + uVar23;
            local_948 = local_948 - (double)uVar23 * dVar60;
            bVar50 = false;
            puVar29 = combined_histo + 2;
            puVar28 = combined_histo + 3;
          }
          if (uVar37 != 0) {
            auVar57._8_4_ = (int)(uVar37 >> 0x20);
            auVar57._0_8_ = uVar37;
            auVar57._12_4_ = 0x45300000;
            dVar60 = (auVar57._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar37) - 4503599627370496.0);
            if (uVar37 < 0x100) {
              dVar52 = (double)kLog2Table[uVar37];
            }
            else {
              dVar52 = log2(dVar60);
            }
            local_948 = local_948 + dVar60 * dVar52;
          }
          uVar23 = 0xc;
          local_928 = 0.0;
          uStack_920 = 0;
          lVar33 = 0;
          while( true ) {
            uVar37 = (ulong)*(uint *)((long)combined_histo + uVar23);
            if (uVar37 < 0x100) {
              dVar60 = (double)kLog2Table[uVar37];
            }
            else {
              dVar60 = log2((double)uVar37);
            }
            uVar49 = lVar33 + uVar37;
            local_928 = local_928 - (double)uVar37 * dVar60;
            if (0x13 < uVar23) break;
            uVar37 = (ulong)*(uint *)((long)combined_histo + uVar23 + 4);
            if (uVar37 < 0x100) {
              dVar60 = (double)kLog2Table[uVar37];
            }
            else {
              dVar60 = log2((double)uVar37);
            }
            lVar33 = uVar49 + uVar37;
            local_928 = local_928 - (double)uVar37 * dVar60;
            uVar23 = uVar23 + 8;
          }
          if (uVar49 != 0) {
            auVar58._8_4_ = (int)(uVar49 >> 0x20);
            auVar58._0_8_ = uVar49;
            auVar58._12_4_ = 0x45300000;
            dVar60 = (auVar58._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar49) - 4503599627370496.0);
            if (uVar49 < 0x100) {
              dVar52 = (double)kLog2Table[uVar49];
            }
            else {
              dVar52 = log2(dVar60);
            }
            local_928 = local_928 + dVar60 * dVar52;
          }
          local_980 = 0.0;
          lVar33 = 0;
          while (lVar33 != 3) {
            bVar50 = true;
            dVar60 = 0.0;
            lVar27 = 0;
            uVar23 = 0;
            local_930 = lVar33;
            while( true ) {
              uVar37 = (ulong)*(uint *)((long)&storage_ix + uVar23 + lVar33 * 0xc);
              dVar52 = (double)uVar37;
              if (uVar37 < 0x100) {
                dVar61 = (double)kLog2Table[uVar37];
              }
              else {
                local_958 = dVar52;
                dVar61 = log2(dVar52);
                dVar52 = local_958;
              }
              uVar37 = lVar27 + uVar37;
              dVar60 = dVar60 - dVar52 * dVar61;
              if (!bVar50) break;
              uVar23 = (ulong)*(uint *)((long)&storage_ix + (uVar23 | 4) + lVar33 * 0xc);
              dVar52 = (double)uVar23;
              if (uVar23 < 0x100) {
                dVar61 = (double)kLog2Table[uVar23];
              }
              else {
                local_958 = dVar52;
                dVar61 = log2(dVar52);
                dVar52 = local_958;
              }
              lVar27 = uVar37 + uVar23;
              dVar60 = dVar60 - dVar52 * dVar61;
              bVar50 = false;
              uVar23 = 8;
            }
            if (uVar37 != 0) {
              auVar59._8_4_ = (int)(uVar37 >> 0x20);
              auVar59._0_8_ = uVar37;
              auVar59._12_4_ = 0x45300000;
              dVar61 = auVar59._8_8_ - 1.9342813113834067e+25;
              dVar52 = dVar61 + ((double)CONCAT44(0x43300000,(int)uVar37) - 4503599627370496.0);
              if (uVar37 < 0x100) {
                dVar61 = (double)kLog2Table[uVar37];
              }
              else {
                local_958 = dVar52;
                dStack_950 = dVar61;
                dVar61 = log2(dVar52);
                dVar52 = local_958;
              }
              dVar60 = dVar60 + dVar52 * dVar61;
            }
            local_980 = local_980 + dVar60;
            lVar33 = local_930 + 1;
          }
          dVar60 = 1.0 / (double)(monogram_histo[1] + monogram_histo[0] + monogram_histo[2]);
          dVar52 = local_918 * dVar60;
          dVar61 = (local_948 + local_928) * dVar60;
          if (local_8e8 < 7) {
            local_980 = dVar52 * 10.0;
          }
          else {
            local_980 = local_980 * dVar60;
          }
          if ((0.2 <= dVar52 - dVar61) || (0.2 <= dVar52 - local_980)) {
            if (dVar61 - local_980 < 0.02) {
              static_context_map = ChooseContextMap_kStaticContextMapSimpleUTF8;
              local_990 = 2;
            }
            else {
              static_context_map = ChooseContextMap_kStaticContextMapContinuation;
            }
          }
          else {
            static_context_map = (undefined1 *)0x0;
            local_990 = 1;
          }
          uVar44 = (uint8_t)local_8f8;
        }
      }
      else {
        static_context_map = (undefined1 *)0x0;
      }
LAB_00126531:
      BrotliBuildMetaBlockGreedy
                (m,data,uVar25,uVar38,(uint8_t)local_8e4,uVar44,local_8a0,local_990,
                 (uint32_t *)static_context_map,pCVar24,num_commands_00,
                 (MetaBlockSplit *)&table_size);
    }
    else {
      BrotliBuildMetaBlock
                (m,data,uVar25,uVar38,&block_params,local_958._0_1_,local_948._0_1_,pCVar24,
                 num_commands_00,(ContextType)local_960,(MetaBlockSplit *)&table_size);
    }
    if (3 < (local_968->params).quality) {
      uVar16 = 0x220;
      if (block_params.dist.alphabet_size < 0x220) {
        uVar16 = block_params.dist.alphabet_size;
      }
      BrotliOptimizeHistograms(uVar16,(MetaBlockSplit *)&table_size);
    }
    BrotliStoreMetaBlock
              (m,data,uVar25,local_8b8,uVar38,(uint8_t)local_8e4,(uint8_t)local_8f8,is_last,
               &block_params,(ContextType)local_960,pCVar24,num_commands_00,
               (MetaBlockSplit *)&table_size,&storage_ix_1,puVar21);
    BrotliDestroyBlockSplit(m,(BlockSplit *)&table_size);
    BrotliDestroyBlockSplit(m,&local_7e8);
    BrotliDestroyBlockSplit(m,&local_7b8);
    BrotliFree(m,local_788);
    local_788 = (uint32_t *)0x0;
    BrotliFree(m,local_778);
    local_778 = (uint32_t *)0x0;
    BrotliFree(m,local_768);
    local_768 = (HistogramLiteral *)0x0;
    BrotliFree(m,local_758);
    uVar23 = local_8b8;
    local_758 = (HistogramCommand *)0x0;
    BrotliFree(m,local_748);
    piVar22 = local_900;
  }
  if (uVar23 + 4 < storage_ix_1 >> 3) {
    uVar11 = *(undefined8 *)(piVar22 + 2);
    *(undefined8 *)local_8f0 = *(undefined8 *)piVar22;
    *(undefined8 *)(local_8f0 + 2) = uVar11;
    *puVar21 = uVar3;
    puVar21[1] = (uint8_t)local_8d0;
    storage_ix_1 = local_8c8;
    BrotliStoreUncompressedMetaBlock(is_last,data,uVar25,uVar38,uVar23,&storage_ix_1,puVar21);
  }
LAB_0012670c:
  pBVar13 = local_968;
  uVar38 = storage_ix_1 >> 3;
  local_968->last_bytes_ = (ushort)puVar21[uVar38];
  local_968->last_bytes_bits_ = (byte)storage_ix_1 & 7;
  local_968->last_flush_pos_ = local_968->input_pos_;
  iVar18 = UpdateLastProcessedPos(local_968);
  if ((iVar18 != 0) && (puVar10 = pBVar13->hasher_, puVar10 != (HasherHandle)0x0)) {
    puVar10[0x14] = '\0';
    puVar10[0x15] = '\0';
    puVar10[0x16] = '\0';
    puVar10[0x17] = '\0';
  }
  uVar8 = pBVar13->last_flush_pos_;
  if (uVar8 != 0) {
    pBVar13->prev_byte_ = data[uVar6 & (int)uVar8 - 1U];
    if (uVar8 != 1) {
      pBVar13->prev_byte2_ = data[uVar6 & (int)uVar8 - 2U];
    }
  }
  *local_8c0 = 0;
  local_8c0[1] = 0;
  uVar11 = *(undefined8 *)(local_8f0 + 2);
  *(undefined8 *)piVar22 = *(undefined8 *)local_8f0;
  *(undefined8 *)(piVar22 + 2) = uVar11;
  *local_8b0 = puVar21;
  *out_size = uVar38;
  return 1;
code_r0x00124cdc:
  lVar43 = lVar43 + -8;
  uVar46 = uVar46 + 1;
  goto LAB_00124cc6;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}